

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bool peparse::readWord(bounded_buffer *b,uint32_t offset,uint16_t *out)

{
  ushort uVar1;
  ushort uVar2;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  if (b == (bounded_buffer *)0x0) {
    err = 10;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0x6a,f);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  else {
    if ((ulong)offset + 1 < (ulong)b->bufLen) {
      uVar1 = *(ushort *)(b->buf + offset);
      uVar2 = uVar1 << 8 | uVar1 >> 8;
      if (b->swapBytes == false) {
        uVar2 = uVar1;
      }
      *out = uVar2;
      return true;
    }
    err = 0xb;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_28,0x6f,f_00);
    std::operator+(&bStack_48,":",&local_28);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&bStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool readWord(bounded_buffer *b, std::uint32_t offset, std::uint16_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 1 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  std::uint16_t tmp;
  memcpy(&tmp, (b->buf + offset), sizeof(std::uint16_t));
  if (b->swapBytes) {
    out = byteSwapUint16(tmp);
  } else {
    out = tmp;
  }

  return true;
}